

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O2

void __thiscall
random_tests::fastrandom_tests_nondeterministic::test_method
          (fastrandom_tests_nondeterministic *this)

{
  long lVar1;
  bool bVar2;
  uint64_t uVar3;
  long lVar4;
  uint64_t uVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  check_type cVar8;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_450;
  char **local_438;
  assertion_result local_430;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 local_188 [8];
  element_type *local_180;
  shared_count asStack_178 [2];
  undefined1 local_168 [8];
  element_type *local_160;
  shared_count sStack_158;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *local_150;
  FastRandomContext ctx4;
  FastRandomContext ctx3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x55;
  file.m_begin = (iterator)&local_198;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
  FastRandomContext::FastRandomContext(&ctx3,false);
  uVar3 = FastRandomContext::rand64(&ctx3);
  local_160 = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  ctx4.rng.m_aligned.input._8_8_ = local_188;
  local_188 = (undefined1  [8])0xbcdce0;
  local_180 = (element_type *)0xbcdd26;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011481f0;
  ctx4.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1b0 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_168[0] = (class_property<bool>)(class_property<bool>)(uVar3 != 0x817c4df1d77c8518);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)&ctx4,1,0,WARN,_cVar8,(size_t)&local_1b8,
             0x55);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&ctx3.rng);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x56;
  file_00.m_begin = (iterator)&local_1c8;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d8,
             msg_00);
  FastRandomContext::FastRandomContext(&ctx3,false);
  uVar3 = RandomMixin<FastRandomContext>::randbits<31>(&ctx3.super_RandomMixin<FastRandomContext>);
  local_168[0] = (class_property<bool>)((int)uVar3 != 0x24e40c69);
  local_160 = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_188 = (undefined1  [8])0xbcdd27;
  local_180 = (element_type *)0xbcdd58;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011481f0;
  ctx4.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx4.rng.m_aligned.input._8_8_ = local_188;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1e0 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)&ctx4,1,0,WARN,_cVar8,(size_t)&local_1e8,
             0x56);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&ctx3.rng);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x57;
  file_01.m_begin = (iterator)&local_1f8;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_208,
             msg_01);
  FastRandomContext::FastRandomContext(&ctx3,false);
  lVar4 = RandomMixin<FastRandomContext>::randrange<long>
                    (&ctx3.super_RandomMixin<FastRandomContext>,3600000000);
  local_168[0] = (class_property<bool>)(lVar4 != 0x4bc48769);
  local_160 = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_188 = (undefined1  [8])0xbcdd59;
  local_180 = (element_type *)0xbcddab;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011481f0;
  ctx4.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx4.rng.m_aligned.input._8_8_ = local_188;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_210 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)&ctx4,1,0,WARN,_cVar8,(size_t)&local_218,
             0x57);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&ctx3.rng);
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = &DAT_00000058;
  file_02.m_begin = (iterator)&local_228;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_238,
             msg_02);
  FastRandomContext::FastRandomContext(&ctx3,false);
  lVar4 = RandomMixin<FastRandomContext>::randrange<long>
                    (&ctx3.super_RandomMixin<FastRandomContext>,3600000);
  local_168[0] = (class_property<bool>)(lVar4 != 0x2ac74e);
  local_160 = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_188 = (undefined1  [8])0xbcddac;
  local_180 = (element_type *)0xbcddfb;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011481f0;
  ctx4.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx4.rng.m_aligned.input._8_8_ = local_188;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_240 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)&ctx4,1,0,WARN,_cVar8,(size_t)&local_248,
             0x58);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&ctx3.rng);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x5a;
  file_03.m_begin = (iterator)&local_258;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_268,
             msg_03);
  FastRandomContext::FastRandomContext(&ctx3,false);
  uVar3 = FastRandomContext::rand64(&ctx3);
  local_168[0] = (class_property<bool>)(uVar3 != 0x8d2695759f656366);
  local_160 = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_188 = (undefined1  [8])0xbcddfc;
  local_180 = (element_type *)0xbcde43;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011481f0;
  ctx4.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx4.rng.m_aligned.input._8_8_ = local_188;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_270 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)&ctx4,1,0,WARN,_cVar8,(size_t)&local_278,
             0x5a);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&ctx3.rng);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x5b;
  file_04.m_begin = (iterator)&local_288;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_298,
             msg_04);
  FastRandomContext::FastRandomContext(&ctx3,false);
  uVar3 = RandomMixin<FastRandomContext>::randbits<31>(&ctx3.super_RandomMixin<FastRandomContext>);
  local_168[0] = (class_property<bool>)((int)uVar3 != 0x64ad5b65);
  local_160 = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_188 = (undefined1  [8])0xbcde44;
  local_180 = (element_type *)0xbcde76;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011481f0;
  ctx4.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx4.rng.m_aligned.input._8_8_ = local_188;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_2a0 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)&ctx4,1,0,WARN,_cVar8,(size_t)&local_2a8,
             0x5b);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&ctx3.rng);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x5c;
  file_05.m_begin = (iterator)&local_2b8;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2c8,
             msg_05);
  FastRandomContext::FastRandomContext(&ctx3,false);
  lVar4 = RandomMixin<FastRandomContext>::randrange<long>
                    (&ctx3.super_RandomMixin<FastRandomContext>,3600000000);
  local_168[0] = (class_property<bool>)(lVar4 != 0x92e77a84);
  local_160 = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_188 = (undefined1  [8])0xbcde77;
  local_180 = (element_type *)0xbcdec9;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011481f0;
  ctx4.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx4.rng.m_aligned.input._8_8_ = local_188;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_2d0 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)&ctx4,1,0,WARN,_cVar8,(size_t)&local_2d8,
             0x5c);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&ctx3.rng);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x5d;
  file_06.m_begin = (iterator)&local_2e8;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2f8,
             msg_06);
  FastRandomContext::FastRandomContext(&ctx3,false);
  lVar4 = RandomMixin<FastRandomContext>::randrange<long>
                    (&ctx3.super_RandomMixin<FastRandomContext>,3600000);
  local_168[0] = (class_property<bool>)(lVar4 != 0x23480d);
  local_160 = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_188 = (undefined1  [8])0xbcdeca;
  local_180 = (element_type *)0xbcdf19;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011481f0;
  ctx4.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx4.rng.m_aligned.input._8_8_ = local_188;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_300 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)&ctx4,1,0,WARN,_cVar8,(size_t)&local_308,
             0x5d);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&ctx3.rng);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x5f;
  file_07.m_begin = (iterator)&local_318;
  msg_07.m_end = pvVar7;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_328,
             msg_07);
  FastRandomContext::FastRandomContext(&ctx3,false);
  uVar3 = FastRandomContext::rand64(&ctx3);
  local_168[0] = (class_property<bool>)(uVar3 != 0x4ef4d2cc5d4fdd77);
  local_160 = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_188 = (undefined1  [8])0xbcdf1a;
  local_180 = (element_type *)0xbcdf60;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011481f0;
  ctx4.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx4.rng.m_aligned.input._8_8_ = local_188;
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_330 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)&ctx4,1,0,WARN,_cVar8,(size_t)&local_338,
             0x5f);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&ctx3.rng);
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x60;
  file_08.m_begin = (iterator)&local_348;
  msg_08.m_end = pvVar7;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_358,
             msg_08);
  FastRandomContext::FastRandomContext(&ctx3,false);
  uVar3 = RandomMixin<FastRandomContext>::randbits<31>(&ctx3.super_RandomMixin<FastRandomContext>);
  local_168[0] = (class_property<bool>)((int)uVar3 != 0x2ed6f741);
  local_160 = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_188 = (undefined1  [8])0xbcdf61;
  local_180 = (element_type *)0xbcdf92;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011481f0;
  ctx4.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx4.rng.m_aligned.input._8_8_ = local_188;
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_360 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)&ctx4,1,0,WARN,_cVar8,(size_t)&local_368,
             0x60);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&ctx3.rng);
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x61;
  file_09.m_begin = (iterator)&local_378;
  msg_09.m_end = pvVar7;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_388,
             msg_09);
  FastRandomContext::FastRandomContext(&ctx3,false);
  lVar4 = RandomMixin<FastRandomContext>::randrange<long>
                    (&ctx3.super_RandomMixin<FastRandomContext>,3600000000);
  local_168[0] = (class_property<bool>)(lVar4 != 0x5939814);
  local_160 = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_188 = (undefined1  [8])0xbcdf93;
  local_180 = (element_type *)0xbcdfe3;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011481f0;
  ctx4.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx4.rng.m_aligned.input._8_8_ = local_188;
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_390 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)&ctx4,1,0,WARN,_cVar8,(size_t)&local_398,
             0x61);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&ctx3.rng);
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x62;
  file_10.m_begin = (iterator)&local_3a8;
  msg_10.m_end = pvVar7;
  msg_10.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3b8,
             msg_10);
  FastRandomContext::FastRandomContext(&ctx3,false);
  lVar4 = RandomMixin<FastRandomContext>::randrange<long>
                    (&ctx3.super_RandomMixin<FastRandomContext>,3600000);
  local_168[0] = (class_property<bool>)(class_property<bool>)(lVar4 != 0x7bc8e);
  local_160 = (element_type *)0x0;
  sStack_158.pi_ = (sp_counted_base *)0x0;
  local_188 = (undefined1  [8])0xbcdfe4;
  local_180 = (element_type *)0xbce032;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf_size._0_1_ = 0;
  ctx4.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&PTR__lazy_ostream_011481f0;
  ctx4.rng.m_aligned.input._0_8_ = boost::unit_test::lazy_ostream::inst;
  ctx4.rng.m_aligned.input._8_8_ = local_188;
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3c0 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_168,(lazy_ostream *)&ctx4,1,0,WARN,_cVar8,(size_t)&local_3c8,
             0x62);
  boost::detail::shared_count::~shared_count(&sStack_158);
  ChaCha20::~ChaCha20(&ctx3.rng);
  FastRandomContext::FastRandomContext(&ctx3,false);
  FastRandomContext::FastRandomContext(&ctx4,false);
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x67;
  file_11.m_begin = (iterator)&local_3d8;
  msg_11.m_end = pvVar7;
  msg_11.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3e8,
             msg_11);
  uVar3 = FastRandomContext::rand64(&ctx3);
  uVar5 = FastRandomContext::rand64(&ctx4);
  local_180 = (element_type *)0x0;
  asStack_178[0].pi_ = (sp_counted_base *)0x0;
  local_150 = &local_450;
  local_450._M_impl.super__Vector_impl_data._M_start = "ctx3.rand64() != ctx4.rand64()";
  local_450._M_impl.super__Vector_impl_data._M_finish = "";
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_3f0 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_188[0] = (class_property<bool>)(class_property<bool>)(uVar3 != uVar5);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_168,1,0,WARN,_cVar8,
             (size_t)&local_3f8,0x67);
  boost::detail::shared_count::~shared_count(asStack_178);
  ChaCha20::~ChaCha20(&ctx4.rng);
  ChaCha20::~ChaCha20(&ctx3.rng);
  FastRandomContext::FastRandomContext(&ctx3,false);
  FastRandomContext::FastRandomContext(&ctx4,false);
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x6b;
  file_12.m_begin = (iterator)&local_408;
  msg_12.m_end = pvVar7;
  msg_12.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_418,
             msg_12);
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)local_168,&ctx3.super_RandomMixin<FastRandomContext>);
  RandomMixin<FastRandomContext>::rand256
            ((uint256 *)local_188,&ctx4.super_RandomMixin<FastRandomContext>);
  local_430.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ::operator!=((base_blob<256U> *)local_168,(base_blob<256U> *)local_188);
  local_430.m_message.px = (element_type *)0x0;
  local_430.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_460 = "ctx3.rand256() != ctx4.rand256()";
  local_458 = "";
  local_450._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_450._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_450._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011481f0;
  local_450._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst
  ;
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_468 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  local_438 = &local_460;
  boost::test_tools::tt_detail::report_assertion
            (&local_430,(lazy_ostream *)&local_450,1,0,WARN,_cVar8,(size_t)&local_470,0x6b);
  boost::detail::shared_count::~shared_count(&local_430.m_message.pn);
  ChaCha20::~ChaCha20(&ctx4.rng);
  ChaCha20::~ChaCha20(&ctx3.rng);
  FastRandomContext::FastRandomContext(&ctx3,false);
  FastRandomContext::FastRandomContext(&ctx4,false);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp";
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x6f;
  file_13.m_begin = (iterator)&local_480;
  msg_13.m_end = pvVar7;
  msg_13.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_490,
             msg_13);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_450,
             &ctx3.super_RandomMixin<FastRandomContext>,7);
  RandomMixin<FastRandomContext>::randbytes<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_430,
             &ctx4.super_RandomMixin<FastRandomContext>,7);
  bVar2 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_450,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_430);
  local_188[0] = (class_property<bool>)(class_property<bool>)!bVar2;
  local_180 = (element_type *)0x0;
  asStack_178[0].pi_ = (sp_counted_base *)0x0;
  local_460 = "ctx3.randbytes(7) != ctx4.randbytes(7)";
  local_458 = "";
  local_160 = (element_type *)((ulong)local_160 & 0xffffffffffffff00);
  local_168 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_158.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_150 = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_460;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_188,(lazy_ostream *)local_168,1,0,WARN,0xbcd7e0,
             (size_t)&stack0xfffffffffffffb60,0x6f);
  boost::detail::shared_count::~shared_count(asStack_178);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_430);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_450);
  ChaCha20::~ChaCha20(&ctx4.rng);
  ChaCha20::~ChaCha20(&ctx3.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(fastrandom_tests_nondeterministic)
{
    // Check that a nondeterministic ones are not
    {
        BOOST_CHECK(FastRandomContext().rand<uint64_t>() != uint64_t{9330418229102544152u});
        BOOST_CHECK(FastRandomContext().rand<int>() != int{618925161});
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::microseconds>(1h).count() != 1271170921);
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count() != 2803534);

        BOOST_CHECK(FastRandomContext().rand<uint64_t>() != uint64_t{10170981140880778086u});
        BOOST_CHECK(FastRandomContext().rand<int>() != int{1689082725});
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::microseconds>(1h).count() != 2464643716);
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count() != 2312205);

        BOOST_CHECK(FastRandomContext().rand<uint64_t>() != uint64_t{5689404004456455543u});
        BOOST_CHECK(FastRandomContext().rand<int>() != int{785839937});
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::microseconds>(1h).count() != 93558804);
        BOOST_CHECK(FastRandomContext().randrange<std::chrono::milliseconds>(1h).count() != 507022);
    }

    {
        FastRandomContext ctx3, ctx4;
        BOOST_CHECK(ctx3.rand64() != ctx4.rand64()); // extremely unlikely to be equal
    }
    {
        FastRandomContext ctx3, ctx4;
        BOOST_CHECK(ctx3.rand256() != ctx4.rand256());
    }
    {
        FastRandomContext ctx3, ctx4;
        BOOST_CHECK(ctx3.randbytes(7) != ctx4.randbytes(7));
    }
}